

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O3

void bc_trie_insert(bc_trie_t *trie,char *key,void *data)

{
  bc_trie_node_t *pbVar1;
  char cVar2;
  bc_trie_node_t *pbVar3;
  
  if (data != (void *)0x0 && (key != (char *)0x0 && trie != (bc_trie_t *)0x0)) {
    pbVar3 = (bc_trie_node_t *)0x0;
    do {
      pbVar1 = trie->root;
      if ((pbVar1 == (bc_trie_node_t *)0x0) ||
         ((pbVar3 != (bc_trie_node_t *)0x0 &&
          (pbVar1 = pbVar3->child, pbVar1 == (_bc_trie_node_t *)0x0)))) {
        pbVar1 = (bc_trie_node_t *)bc_malloc(0x20);
        pbVar1->key = *key;
        pbVar1->data = (void *)0x0;
        pbVar1->next = (_bc_trie_node_t *)0x0;
        pbVar1->child = (_bc_trie_node_t *)0x0;
        if (trie->root == (bc_trie_node_t *)0x0) {
          trie->root = pbVar1;
        }
        else {
          pbVar3->child = pbVar1;
        }
      }
      else {
        cVar2 = *key;
        do {
          pbVar3 = pbVar1;
          pbVar1 = pbVar3;
          if (pbVar3->key == cVar2) goto LAB_00109b66;
          pbVar1 = pbVar3->next;
        } while (pbVar3->next != (_bc_trie_node_t *)0x0);
        pbVar1 = (bc_trie_node_t *)bc_malloc(0x20);
        pbVar1->key = *key;
        pbVar1->data = (void *)0x0;
        pbVar1->next = (_bc_trie_node_t *)0x0;
        pbVar1->child = (_bc_trie_node_t *)0x0;
        pbVar3->next = pbVar1;
      }
      cVar2 = *key;
LAB_00109b66:
      key = key + 1;
      pbVar3 = pbVar1;
    } while (cVar2 != '\0');
    if ((pbVar1->data != (void *)0x0) && (trie->free_func != (bc_free_func_t)0x0)) {
      (*trie->free_func)(pbVar1->data);
    }
    pbVar1->data = data;
  }
  return;
}

Assistant:

void
bc_trie_insert(bc_trie_t *trie, const char *key, void *data)
{
    if (trie == NULL || key == NULL || data == NULL)
        return;

    bc_trie_node_t *parent = NULL;
    bc_trie_node_t *previous;
    bc_trie_node_t *current;
    bc_trie_node_t *tmp;

    while (1) {

        if (trie->root == NULL || (parent != NULL && parent->child == NULL)) {
            current = bc_malloc(sizeof(bc_trie_node_t));
            current->key = *key;
            current->data = NULL;
            current->next = NULL;
            current->child = NULL;
            if (trie->root == NULL)
                trie->root = current;
            else
                parent->child = current;
            parent = current;
            goto clean;
        }

        tmp = parent == NULL ? trie->root : parent->child;
        previous = NULL;

        while (tmp != NULL && tmp->key != *key) {
            previous = tmp;
            tmp = tmp->next;
        }

        parent = tmp;

        if (previous == NULL || parent != NULL)
            goto clean;

        current = bc_malloc(sizeof(bc_trie_node_t));
        current->key = *key;
        current->data = NULL;
        current->next = NULL;
        current->child = NULL;
        previous->next = current;
        parent = current;

clean:
        if (*key == '\0') {
            if (parent->data != NULL && trie->free_func != NULL)
                trie->free_func(parent->data);
            parent->data = data;
            break;
        }
        key++;
    }
}